

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_DecodeIntegers<unsigned_int>
                 (char *data,size_t numInts,uint *result)

{
  uint *local_50;
  size_t intsLeft;
  char *pcStack_40;
  SInt prevVal;
  char *vintsIn;
  char *codesIn;
  size_t numCodesBytes;
  uint *puStack_20;
  int commonValue;
  uint *result_local;
  size_t numInts_local;
  char *data_local;
  
  puStack_20 = result;
  result_local = (uint *)numInts;
  numInts_local = (size_t)data;
  numCodesBytes._4_4_ = _ReadBits<int>((char **)&numInts_local);
  codesIn = (char *)((long)result_local * 2 + 7U >> 3);
  vintsIn = (char *)numInts_local;
  pcStack_40 = codesIn + numInts_local;
  intsLeft._4_4_ = 0;
  for (local_50 = result_local; (uint *)0x3 < local_50; local_50 = local_50 + -1) {
    (anonymous_namespace)::_DecodeNHelper<4,unsigned_int*>
              (&vintsIn,&stack0xffffffffffffffc0,numCodesBytes._4_4_,(type *)((long)&intsLeft + 4),
               &stack0xffffffffffffffe0);
  }
  switch(local_50) {
  case (uint *)0x0:
    break;
  case (uint *)0x1:
    (anonymous_namespace)::_DecodeNHelper<1,unsigned_int*>
              (&vintsIn,&stack0xffffffffffffffc0,numCodesBytes._4_4_,(type *)((long)&intsLeft + 4),
               &stack0xffffffffffffffe0);
    break;
  case (uint *)0x2:
    (anonymous_namespace)::_DecodeNHelper<2,unsigned_int*>
              (&vintsIn,&stack0xffffffffffffffc0,numCodesBytes._4_4_,(type *)((long)&intsLeft + 4),
               &stack0xffffffffffffffe0);
    break;
  case (uint *)0x3:
    (anonymous_namespace)::_DecodeNHelper<3,unsigned_int*>
              (&vintsIn,&stack0xffffffffffffffc0,numCodesBytes._4_4_,(type *)((long)&intsLeft + 4),
               &stack0xffffffffffffffe0);
  }
  return (size_t)result_local;
}

Assistant:

size_t _DecodeIntegers(char const *data, size_t numInts, Int *result)
{
    using SInt = typename std::make_signed<Int>::type;

    auto commonValue = _ReadBits<SInt>(data);

    size_t numCodesBytes = (numInts * 2 + 7) / 8;
    char const *codesIn = data;
    char const *vintsIn = data + numCodesBytes;

    SInt prevVal = 0;
    auto intsLeft = numInts;
    while (intsLeft >= 4) {
        _DecodeNHelper<4>(codesIn, vintsIn, commonValue, prevVal, result);
        intsLeft -= 4;
    }
    switch (intsLeft) {
    case 0: default: break;
    case 1: _DecodeNHelper<1>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    case 2: _DecodeNHelper<2>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    case 3: _DecodeNHelper<3>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    };

    return numInts;
}